

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_schema.c
# Opt level: O3

reflection_Type_ref_t export_type(flatcc_builder_t *B,fb_value_t type)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  flatcc_builder_ref_t fVar9;
  int *piVar10;
  short *psVar11;
  char *pcVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  
  iVar8 = -1;
  cVar15 = '\x0e';
  lVar2 = type.field_0._0_8_;
  iVar7 = iVar8;
  cVar6 = '\x0e';
  switch(type.type) {
  case 8:
LAB_00118809:
    cVar6 = '\x0e';
    bVar4 = true;
    bVar5 = false;
    goto LAB_00118850;
  case 9:
LAB_0011884c:
    bVar4 = false;
    bVar5 = true;
    cVar6 = '\0';
LAB_00118850:
    bVar3 = false;
    cVar15 = '\0';
    type.len._0_2_ = 0;
    iVar7 = iVar8;
    goto LAB_00118919;
  case 10:
    type.len._0_2_ = 0;
    cVar13 = '\r';
    break;
  case 0xb:
    cVar15 = '\r';
    cVar13 = '\0';
LAB_001188a6:
    iVar7 = iVar8;
    type.len._0_2_ = 0;
    cVar6 = cVar15;
    break;
  default:
switchD_00118805_caseD_c:
    cVar14 = '\0';
    type.len._0_2_ = 0;
    cVar15 = '\0';
    goto LAB_00118ad5;
  case 0xf:
    iVar7 = *(int *)(lVar2 + 0xd0);
    uVar1 = *(ushort *)(lVar2 + 0x10);
    type.len._0_2_ = 0;
    cVar14 = '\0';
    cVar13 = '\0';
    cVar6 = '\x0f';
    if (1 < uVar1) {
      if (uVar1 == 4) {
        cVar15 = '\x10';
        cVar13 = '\0';
        iVar8 = iVar7;
        goto LAB_001188a6;
      }
      cVar15 = '\0';
      if (uVar1 != 3) goto LAB_00118ad5;
      type.field_0.st = *(fb_scalar_type_t *)(lVar2 + 0x50);
      iVar8 = iVar7;
      goto LAB_0011884c;
    }
    break;
  case 0x10:
    iVar8 = *(int *)(lVar2 + 0xd0);
    uVar1 = *(ushort *)(lVar2 + 0x10);
    iVar7 = iVar8;
    type.len._0_2_ = 0;
    cVar13 = '\x0f';
    if (1 < uVar1) {
      if (uVar1 == 4) {
        cVar13 = '\x10';
        goto LAB_001188a6;
      }
      if (uVar1 != 3) goto switchD_00118805_caseD_c;
      type.field_0.st = *(fb_scalar_type_t *)(lVar2 + 0x50);
      goto LAB_00118809;
    }
    break;
  case 0x11:
    cVar6 = '\x11';
    bVar3 = true;
    bVar5 = false;
    bVar4 = false;
    cVar15 = '\0';
    goto LAB_00118919;
  case 0x14:
    uVar1 = *(ushort *)(lVar2 + 0x10);
    type.field_0.st = fb_missing_type;
    if (uVar1 < 2) {
      cVar15 = '\x0f';
    }
    else if (uVar1 == 4) {
      cVar15 = '\x10';
    }
    else {
      cVar15 = '\0';
      if (uVar1 == 3) {
        type.field_0.st = *(fb_scalar_type_t *)(lVar2 + 0x50);
        cVar15 = '\0';
      }
    }
    cVar6 = '\x11';
    bVar3 = true;
    bVar5 = false;
    bVar4 = false;
    iVar7 = *(int *)(lVar2 + 0xd0);
LAB_00118919:
    iVar8 = iVar7;
    cVar13 = cVar15;
    switch(type.field_0.st) {
    case fb_ulong:
      cVar14 = '\n';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\n';
      break;
    case fb_uint:
      cVar14 = '\b';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\b';
      break;
    case fb_ushort:
      cVar14 = '\x06';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\x06';
      break;
    case fb_ubyte:
      cVar14 = '\x04';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\x04';
      break;
    case fb_bool:
      cVar14 = '\x02';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\x02';
      break;
    case fb_long:
      cVar14 = '\t';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\t';
      break;
    case fb_int:
      cVar14 = '\a';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\a';
      break;
    case fb_short:
      cVar14 = '\x05';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\x05';
      break;
    case fb_byte:
    case fb_char:
      cVar14 = '\x03';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\x03';
      break;
    case fb_double:
      cVar14 = '\f';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\f';
      break;
    case fb_float:
      cVar14 = '\v';
      if (cVar15 != '\0') {
        cVar14 = cVar15;
      }
      if (bVar3) {
        cVar13 = cVar14;
      }
      if (bVar4) {
        cVar13 = cVar14;
      }
      cVar14 = '\v';
      break;
    default:
      if (bVar5) {
        cVar14 = '\0';
        goto LAB_00118ad5;
      }
      goto LAB_00118acf;
    }
    if (bVar5) goto LAB_00118ad5;
  }
LAB_00118acf:
  cVar14 = cVar6;
  cVar15 = cVar13;
  iVar8 = iVar7;
LAB_00118ad5:
  iVar7 = flatcc_builder_start_table(B,4);
  if (iVar7 != 0) {
    return 0;
  }
  if (iVar8 != -1) {
    piVar10 = (int *)flatcc_builder_table_add(B,2,4,4);
    if (piVar10 == (int *)0x0) {
      return 0;
    }
    *piVar10 = iVar8;
  }
  if ((short)type.len != 0) {
    psVar11 = (short *)flatcc_builder_table_add(B,3,2,2);
    if (psVar11 == (short *)0x0) {
      return 0;
    }
    *psVar11 = (short)type.len;
  }
  if (cVar14 != '\0') {
    pcVar12 = (char *)flatcc_builder_table_add(B,0,1,1);
    if (pcVar12 == (char *)0x0) {
      return 0;
    }
    *pcVar12 = cVar14;
  }
  if (cVar15 != '\0') {
    pcVar12 = (char *)flatcc_builder_table_add(B,1,1,1);
    if (pcVar12 == (char *)0x0) {
      return 0;
    }
    *pcVar12 = cVar15;
  }
  iVar8 = flatcc_builder_check_required(B,__reflection_Type_required,0);
  if (iVar8 == 0) {
    __assert_fail("flatcc_builder_check_required(B, __reflection_Type_required, sizeof(__reflection_Type_required) / sizeof(__reflection_Type_required[0]) - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/reflection/reflection_builder.h"
                  ,0x19,"reflection_Type_ref_t reflection_Type_end(flatbuffers_builder_t *)");
  }
  fVar9 = flatcc_builder_end_table(B);
  return fVar9;
}

Assistant:

static reflection_Type_ref_t export_type(flatcc_builder_t *B, fb_value_t type)
{
    fb_scalar_type_t st = fb_missing_type;
    int32_t index = -1;
    reflection_BaseType_enum_t base_type = BaseType(None);
    reflection_BaseType_enum_t element = BaseType(None);
    reflection_BaseType_enum_t primitive = BaseType(None);
    uint16_t fixed_length = 0;

    switch (type.type) {
    case vt_scalar_type:
        st = type.st;
        break;
    case vt_vector_type:
        st = type.st;
        base_type = BaseType(Vector);
        break;
    case vt_vector_string_type:
        element = BaseType(String);
        base_type = BaseType(Vector);
        break;
    case vt_vector_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            base_type = BaseType(Vector);
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Vector);
            element = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Vector);
            element = BaseType(Union);
            break;
        default:
            break;
        }
        break;
    case vt_string_type:
        base_type = BaseType(String);
        break;
    case vt_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Union);
            break;
        default:
            index = -1;
            break;
        }
        break;
    case vt_fixed_array_type:
        st = type.st;
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_string_type:
        break;
        element = BaseType(Byte);
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            element = BaseType(Obj);
            break;
        case fb_is_union:
            element = BaseType(Union);
            break;
        default:
            break;
        }
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    default:
        break;
    }
    /* If st is set, resolve scalar type and set it to base_type or element. */
    switch (st) {
    case fb_missing_type: break;
    case fb_ulong: primitive = BaseType(ULong); break;
    case fb_uint: primitive = BaseType(UInt); break;
    case fb_ushort: primitive = BaseType(UShort); break;
    case fb_ubyte: primitive = BaseType(UByte); break;
    case fb_bool: primitive = BaseType(Bool); break;
    case fb_long: primitive = BaseType(Long); break;
    case fb_int: primitive = BaseType(Int); break;
    case fb_short: primitive = BaseType(Short); break;
    case fb_byte: primitive = BaseType(Byte); break;
    case fb_double: primitive = BaseType(Double); break;
    case fb_float: primitive = BaseType(Float); break;
    /* TODO: Googles flatc tool does not have char arrays so we use Byte as element type */
    case fb_char: primitive = BaseType(Byte); break;
    default: break;
    }

    if (base_type == BaseType(None)) {
        base_type = primitive;
    } else if (base_type == BaseType(Vector) || base_type == BaseType(Array)) {
        if (element == BaseType(None)) {
            element = primitive;
        }
    }
    return reflection_Type_create(B, base_type, element, index, fixed_length);
}